

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

MeasuredBRDF * pbrt::MeasuredBRDF::Create(string *filename,Allocator alloc)

{
  char *pcVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  float *pfVar10;
  size_type n;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar11;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar12;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar13;
  undefined1 auVar14 [16];
  array<int,_3> aVar15;
  array<const_float_*,_2> aVar16;
  array<const_float_*,_2> aVar17;
  array<const_float_*,_3> aVar18;
  int iVar19;
  Field *pFVar20;
  Field *pFVar21;
  Field *pFVar22;
  Field *pFVar23;
  Field *pFVar24;
  undefined4 extraout_var;
  long lVar25;
  size_type sVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  int reduction;
  Tensor tf;
  undefined1 local_1b0 [176];
  Field *local_100;
  Field *local_f8;
  Field *local_f0;
  Field *local_e8;
  Field *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  int local_d0;
  uchar *local_c8;
  uchar *puStack_c0;
  float *local_b8;
  uchar *local_b0;
  uchar *puStack_a8;
  uchar *local_a0;
  uchar *puStack_98;
  Tensor local_90;
  MeasuredBRDF *this;
  
  Tensor::Tensor(&local_90,filename);
  pcVar1 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"theta_i","");
  pFVar20 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"phi_i","");
  pFVar21 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"ndf","");
  local_e0 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"sigma","");
  local_e8 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"vndf","");
  local_f0 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"spectra","");
  local_100 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"luminance","");
  local_f8 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"wavelengths","");
  pFVar22 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"description","");
  pFVar23 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"jacobian","");
  pFVar24 = Tensor::field(&local_90,(string *)local_1b0);
  if ((char *)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  if (((((((((long)(pFVar23->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pFVar23->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 8) && (pFVar23->dtype == UInt8)) &&
          (puVar2 = (pFVar20->shape).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (long)(pFVar20->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 8)) &&
         (((pFVar20->dtype == Float32 &&
           (puVar3 = (pFVar21->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (long)(pFVar21->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 == 8)) &&
          ((pFVar21->dtype == Float32 &&
           ((puVar4 = (pFVar22->shape).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (long)(pFVar22->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 8 &&
            (pFVar22->dtype == Float32)))))))) &&
        ((long)(local_e0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(local_e0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x10)) &&
       ((((((local_e0->dtype == Float32 &&
            ((long)(local_e8->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_e8->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10)) && (local_e8->dtype == Float32)) &&
          ((puVar5 = (local_f0->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (long)(local_f0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 == 0x20 &&
           (local_f0->dtype == Float32)))) && (uVar6 = *puVar5, uVar6 == *puVar3)) &&
        (((uVar7 = puVar5[1], uVar7 == *puVar2 &&
          (puVar5 = (local_f8->shape).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (long)(local_f8->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 == 0x20)) &&
         (((local_f8->dtype == Float32 &&
           (((*puVar5 == uVar6 && (puVar5[1] == uVar7)) && (uVar8 = puVar5[2], uVar8 == puVar5[3])))
           ) && (((local_100->dtype == Float32 &&
                  (puVar5 = (local_100->shape).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                  (long)(local_100->shape).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar5 == 0x28)) &&
                 (*puVar5 == uVar6)))))))))) &&
      (((puVar5[1] == uVar7 && (puVar5[2] == *puVar4)) &&
       ((uVar8 == puVar5[4] &&
        (((uVar8 == puVar5[3] && (puVar5[3] == puVar5[4])) &&
         (puVar2 = (pFVar24->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (long)(pFVar24->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 8)))))))) &&
     ((*puVar2 == 1 && (pFVar24->dtype == UInt8)))) {
    iVar19 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x378,8);
    this = (MeasuredBRDF *)CONCAT44(extraout_var,iVar19);
    MeasuredBRDF(this,alloc);
    std::__cxx11::string::_M_assign((string *)&this->filename);
    uVar9 = *(pFVar21->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->isotropic = uVar9 < 3;
    this->jacobian =
         *(pFVar24->data)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != '\0';
    if (2 < uVar9) {
      pfVar10 = (float *)(pFVar21->data)._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      auVar30 = ZEXT416((uint)(6.2831855 / ((pfVar10 + 0xffffffffffffffff)[uVar9] - *pfVar10)));
      auVar30 = vroundss_avx(auVar30,auVar30,4);
      local_1b0._0_4_ = (int)auVar30._0_4_;
      if ((int)auVar30._0_4_ != 1) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  ("%s: reduction %d (!= 1) not supported",filename,(int *)local_1b0);
      }
    }
    puVar2 = (local_e0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    PiecewiseLinear2D<0UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<0UL> *)local_1b0,alloc.memoryResource,
               (local_e0->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar2[1],
               (int)*puVar2,0,0);
    PiecewiseLinear2D<0UL>::operator=
              ((PiecewiseLinear2D<0UL> *)this,(PiecewiseLinear2D<0UL> *)local_1b0);
    PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)local_1b0);
    puVar2 = (local_e8->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    PiecewiseLinear2D<0UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<0UL> *)local_1b0,alloc.memoryResource,
               (local_e8->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar2[1],
               (int)*puVar2,0,0);
    PiecewiseLinear2D<0UL>::operator=(&this->sigma,(PiecewiseLinear2D<0UL> *)local_1b0);
    PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)local_1b0);
    puStack_98 = (pFVar20->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    puVar2 = (local_f0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_a0 = (pFVar21->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    aVar16.values[1]._0_4_ = (int)puStack_98;
    aVar16.values[0] = (float *)local_a0;
    aVar16.values[1]._4_4_ = (int)((ulong)puStack_98 >> 0x20);
    PiecewiseLinear2D<2UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<2UL> *)local_1b0,alloc,
               (float *)(local_f0->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar2[3],
               (int)puVar2[2],
               (array<int,_2>)
               (*(pFVar20->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start << 0x20 |
               (ulong)(uint)*(pFVar21->shape).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start),aVar16,true,true);
    PiecewiseLinear2D<2UL>::operator=(&this->vndf,(PiecewiseLinear2D<2UL> *)local_1b0);
    PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)local_1b0);
    puStack_a8 = (pFVar20->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    puVar2 = (local_f8->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_b0 = (pFVar21->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    aVar17.values[1]._0_4_ = (int)puStack_a8;
    aVar17.values[0] = (float *)local_b0;
    aVar17.values[1]._4_4_ = (int)((ulong)puStack_a8 >> 0x20);
    PiecewiseLinear2D<2UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<2UL> *)local_1b0,alloc,
               (float *)(local_f8->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar2[3],
               (int)puVar2[2],
               (array<int,_2>)
               (*(pFVar20->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start << 0x20 |
               (ulong)(uint)*(pFVar21->shape).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start),aVar17,true,true);
    PiecewiseLinear2D<2UL>::operator=(&this->luminance,(PiecewiseLinear2D<2UL> *)local_1b0);
    PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)local_1b0);
    n = *(pFVar22->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(&this->wavelengths,n);
    local_b8 = (float *)(pFVar22->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (n != 0) {
      pfVar10 = (this->wavelengths).ptr;
      sVar26 = 0;
      do {
        pfVar10[sVar26] = local_b8[sVar26];
        sVar26 = sVar26 + 1;
      } while (n != sVar26);
    }
    puVar2 = (local_100->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uStack_d4 = (undefined4)
                *(pFVar20->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    local_d0 = (int)*(pFVar22->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_d8 = (undefined4)
               *(pFVar21->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_c8 = (pFVar21->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    puStack_c0 = (pFVar20->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    aVar15.values[1] = uStack_d4;
    aVar15.values[0] = local_d8;
    aVar15.values[2] = local_d0;
    aVar18.values[1]._0_4_ = (int)puStack_c0;
    aVar18.values[0] = (float *)local_c8;
    aVar18.values[1]._4_4_ = (int)((ulong)puStack_c0 >> 0x20);
    aVar18.values[2] = local_b8;
    PiecewiseLinear2D<3UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<3UL> *)local_1b0,alloc,
               (float *)(local_100->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar2[4],
               (int)puVar2[3],aVar15,aVar18,false,false);
    PiecewiseLinear2D<3UL>::operator=(&this->spectra,(PiecewiseLinear2D<3UL> *)local_1b0);
    PiecewiseLinear2D<3UL>::~PiecewiseLinear2D((PiecewiseLinear2D<3UL> *)local_1b0);
    vpmovsxwd_avx2(_DAT_02cb11d0);
    vpmovsxwd_avx2(_DAT_02cb11e0);
    pvVar11 = (this->vndf).m_param_values.ptr;
    pvVar12 = (this->luminance).m_param_values.ptr;
    pvVar13 = (this->spectra).m_param_values.ptr;
    lVar25 = pvVar11->nAlloc + pvVar11[1].nAlloc + pvVar12->nAlloc;
    auVar28 = vpgatherdq_avx512f(*(undefined4 *)
                                  ((long)&(this->ndf).m_size.super_Tuple2<pbrt::Vector2,_int>.x +
                                  lVar25));
    auVar29 = vpgatherdq_avx512f(*(undefined4 *)
                                  ((long)&(this->ndf).m_size.super_Tuple2<pbrt::Vector2,_int>.x + n)
                                );
    auVar28 = vpaddq_avx512f(auVar29,auVar28);
    auVar27 = vextracti64x4_avx512f(auVar28,1);
    auVar28 = vpaddq_avx512f(auVar28,ZEXT3264(auVar27));
    auVar30 = vpaddq_avx(auVar28._0_16_,auVar28._16_16_);
    auVar14 = vpshufd_avx(auVar30,0xee);
    auVar30 = vpaddq_avx(auVar30,auVar14);
    *(size_t *)(in_FS_OFFSET + -0x80) =
         lVar25 + pvVar12[1].nAlloc + pvVar13->nAlloc + pvVar13[1].nAlloc + pvVar13[2].nAlloc +
         *(long *)(in_FS_OFFSET + -0x80) + 0x378 + auVar30._0_8_ * 4;
  }
  else {
    local_1b0._8_4_ = 0.0;
    local_1b0._12_4_ = 0.0;
    local_1b0[0x10] = '\0';
    local_1b0._0_8_ = pcVar1;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,pbrt::Tensor&>
              ((string *)local_1b0,"%s: invalid BRDF file structure: %s",filename,&local_90);
    Error((FileLoc *)0x0,(char *)local_1b0._0_8_);
    if ((char *)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
    }
    this = (MeasuredBRDF *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_filename._M_dataplus._M_p != &local_90.m_filename.field_2) {
    operator_delete(local_90.m_filename._M_dataplus._M_p,
                    local_90.m_filename.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_90);
  return this;
}

Assistant:

MeasuredBRDF *MeasuredBRDF::Create(const std::string &filename, Allocator alloc) {
    Tensor tf = Tensor(filename);
    auto &theta_i = tf.field("theta_i");
    auto &phi_i = tf.field("phi_i");
    auto &ndf = tf.field("ndf");
    auto &sigma = tf.field("sigma");
    auto &vndf = tf.field("vndf");
    auto &spectra = tf.field("spectra");
    auto &luminance = tf.field("luminance");
    auto &wavelengths = tf.field("wavelengths");
    auto &description = tf.field("description");
    auto &jacobian = tf.field("jacobian");

    if (!(description.shape.size() == 1 && description.dtype == Tensor::UInt8 &&

          theta_i.shape.size() == 1 && theta_i.dtype == Tensor::Float32 &&

          phi_i.shape.size() == 1 && phi_i.dtype == Tensor::Float32 &&

          wavelengths.shape.size() == 1 && wavelengths.dtype == Tensor::Float32 &&

          ndf.shape.size() == 2 && ndf.dtype == Tensor::Float32 &&

          sigma.shape.size() == 2 && sigma.dtype == Tensor::Float32 &&

          vndf.shape.size() == 4 && vndf.dtype == Tensor::Float32 &&
          vndf.shape[0] == phi_i.shape[0] && vndf.shape[1] == theta_i.shape[0] &&

          luminance.shape.size() == 4 && luminance.dtype == Tensor::Float32 &&
          luminance.shape[0] == phi_i.shape[0] &&
          luminance.shape[1] == theta_i.shape[0] &&
          luminance.shape[2] == luminance.shape[3] &&

          spectra.dtype == Tensor::Float32 && spectra.shape.size() == 5 &&
          spectra.shape[0] == phi_i.shape[0] && spectra.shape[1] == theta_i.shape[0] &&
          spectra.shape[2] == wavelengths.shape[0] &&
          spectra.shape[3] == spectra.shape[4] &&

          luminance.shape[2] == spectra.shape[3] &&
          luminance.shape[3] == spectra.shape[4] &&

          jacobian.shape.size() == 1 && jacobian.shape[0] == 1 &&
          jacobian.dtype == Tensor::UInt8)) {
        Error("%s: invalid BRDF file structure: %s", filename, tf);
        return nullptr;
    }

    MeasuredBRDF *brdf = alloc.new_object<MeasuredBRDF>(alloc);
    brdf->filename = filename;
    brdf->isotropic = phi_i.shape[0] <= 2;
    brdf->jacobian = ((uint8_t *)jacobian.data.get())[0];

    if (!brdf->isotropic) {
        float *phi_i_data = (float *)phi_i.data.get();
        int reduction =
            (int)std::rint((2 * Pi) / (phi_i_data[phi_i.shape[0] - 1] - phi_i_data[0]));
        if (reduction != 1)
            ErrorExit("%s: reduction %d (!= 1) not supported", filename, reduction);
    }

    /* Construct NDF interpolant data structure */
    brdf->ndf = Warp2D0(alloc, (float *)ndf.data.get(), ndf.shape[1], ndf.shape[0], {},
                        {}, false, false);

    /* Construct projected surface area interpolant data structure */
    brdf->sigma = Warp2D0(alloc, (float *)sigma.data.get(), sigma.shape[1],
                          sigma.shape[0], {}, {}, false, false);

    /* Construct VNDF warp data structure */
    brdf->vndf =
        Warp2D2(alloc, (float *)vndf.data.get(), vndf.shape[3], vndf.shape[2],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Construct Luminance warp data structure */
    brdf->luminance =
        Warp2D2(alloc, (float *)luminance.data.get(), luminance.shape[3],
                luminance.shape[2], {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Copy wavelength information */
    size_t size = wavelengths.shape[0];
    brdf->wavelengths.resize(size);
    for (size_t i = 0; i < size; ++i)
        brdf->wavelengths[i] = ((const float *)wavelengths.data.get())[i];

    /* Construct spectral interpolant */
    brdf->spectra =
        Warp2D3(alloc, (float *)spectra.data.get(), spectra.shape[4], spectra.shape[3],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0], (int)wavelengths.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get(),
                  (const float *)wavelengths.data.get()}},
                false, false);

    measuredBRDFBytes += sizeof(MeasuredBRDF) + 4 * brdf->wavelengths.size() +
                         brdf->ndf.BytesUsed() + brdf->sigma.BytesUsed() +
                         brdf->vndf.BytesUsed() + brdf->luminance.BytesUsed() +
                         brdf->spectra.BytesUsed();

    return brdf;
}